

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

int soplex::
    SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (IdxElement *keys,IdxCompare *compare,int start,int end,int size,int start2,int end2,
              bool type)

{
  IdxElement *pIVar1;
  uint *puVar2;
  uint *puVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  fpclass_type fVar7;
  int32_t iVar8;
  int iVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  int32_t iVar33;
  fpclass_type fVar34;
  int32_t iVar35;
  int iVar36;
  IdxElement *pIVar37;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar38;
  long lVar39;
  int iVar40;
  uint uVar41;
  long lVar42;
  fpclass_type *pfVar43;
  uint uVar44;
  uint uVar45;
  ulong uVar46;
  cpp_dec_float<100U,_int,_void> local_4c0;
  IdxElement local_470;
  IdxElement local_41c;
  IdxElement local_3c8;
  IdxElement local_374;
  IdxElement local_320;
  IdxElement local_2cc;
  type t;
  IdxElement local_228;
  IdxElement local_1d4;
  IdxElement local_180;
  IdxElement local_12c;
  IdxElement local_d8;
  IdxElement local_84;
  
  if (end <= start) {
    return 0;
  }
  if (start + 1 == end) {
    return 1;
  }
  if (start2 <= start) {
    start2 = start;
  }
  uVar41 = end - 1;
  if ((int)uVar41 <= start2 + size) {
    SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (keys,end,compare,start2,type);
    return uVar41;
  }
  iVar40 = (int)(start2 + uVar41) / 2;
  pIVar1 = keys + iVar40;
  pIVar37 = keys + iVar40;
  pnVar38 = &pIVar37->val;
  iVar40 = pIVar37->idx;
  uVar10 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 0xc);
  uVar11 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 0xe);
  uVar12 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 8);
  uVar13 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 10);
  uVar14 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 4);
  uVar15 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 6);
  uVar16 = *(undefined8 *)(pnVar38->m_backend).data._M_elems;
  uVar17 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 2);
  iVar6 = (pIVar37->val).m_backend.exp;
  bVar4 = (pIVar37->val).m_backend.neg;
  fVar7 = (pIVar37->val).m_backend.fpclass;
  iVar8 = (pIVar37->val).m_backend.prec_elem;
  lVar39 = (long)start2;
  uVar45 = uVar41;
  uVar44 = start2;
  do {
    uVar46 = (ulong)uVar45;
    if (type) {
      if ((int)uVar44 < (int)uVar41) {
        pfVar43 = &keys[(int)uVar44].val.m_backend.fpclass;
        lVar42 = 0;
        do {
          local_84.idx = pfVar43[-0x13];
          local_84.val.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)(pfVar43 + -0x12))->data)._M_elems
          ;
          local_84.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar43 + -0x10);
          local_84.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar43 + -0xe);
          local_84.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar43 + -0xc);
          local_84.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar43 + -10);
          local_84.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar43 + -8);
          local_84.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar43 + -6);
          local_84.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar43 + -4);
          local_84.val.m_backend.exp = pfVar43[-2];
          local_84.val.m_backend.neg = *(bool *)(pfVar43 + -1);
          local_84.val.m_backend._72_8_ = *(undefined8 *)pfVar43;
          local_2cc.idx = iVar40;
          local_2cc.val.m_backend.data._M_elems._0_8_ = uVar16;
          local_2cc.val.m_backend.data._M_elems._8_8_ = uVar17;
          local_2cc.val.m_backend.data._M_elems._16_8_ = uVar14;
          local_2cc.val.m_backend.data._M_elems._24_8_ = uVar15;
          local_2cc.val.m_backend.data._M_elems._32_8_ = uVar12;
          local_2cc.val.m_backend.data._M_elems._40_8_ = uVar13;
          local_2cc.val.m_backend.data._M_elems._48_8_ = uVar10;
          local_2cc.val.m_backend.data._M_elems._56_8_ = uVar11;
          local_2cc.val.m_backend.exp = iVar6;
          local_2cc.val.m_backend.neg = bVar4;
          local_2cc.val.m_backend.fpclass = fVar7;
          local_2cc.val.m_backend.prec_elem = iVar8;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_4c0,compare,&local_84,&local_2cc);
          if (local_4c0.fpclass == cpp_dec_float_NaN) {
            uVar44 = uVar44 - (int)lVar42;
            goto LAB_00467c6a;
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,0,(type *)0x0);
          iVar36 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_4c0,&t.m_backend);
          if (-1 < iVar36) {
            uVar44 = uVar44 - (int)lVar42;
            goto LAB_00467c6a;
          }
          lVar42 = lVar42 + -1;
          pfVar43 = pfVar43 + 0x15;
        } while ((long)(int)uVar44 - (long)(int)uVar41 != lVar42);
        uVar44 = uVar44 - (int)lVar42;
      }
LAB_00467c6a:
      if (start2 < (int)uVar45) {
        uVar46 = (ulong)(int)uVar45;
        pfVar43 = &keys[uVar46].val.m_backend.fpclass;
        do {
          local_d8.idx = pfVar43[-0x13];
          local_d8.val.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)(pfVar43 + -0x12))->data)._M_elems
          ;
          local_d8.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar43 + -0x10);
          local_d8.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar43 + -0xe);
          local_d8.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar43 + -0xc);
          local_d8.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar43 + -10);
          local_d8.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar43 + -8);
          local_d8.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar43 + -6);
          local_d8.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar43 + -4);
          local_d8.val.m_backend.exp = pfVar43[-2];
          local_d8.val.m_backend.neg = *(bool *)(pfVar43 + -1);
          local_d8.val.m_backend._72_8_ = *(undefined8 *)pfVar43;
          local_320.idx = iVar40;
          local_320.val.m_backend.data._M_elems._0_8_ = uVar16;
          local_320.val.m_backend.data._M_elems._8_8_ = uVar17;
          local_320.val.m_backend.data._M_elems._16_8_ = uVar14;
          local_320.val.m_backend.data._M_elems._24_8_ = uVar15;
          local_320.val.m_backend.data._M_elems._32_8_ = uVar12;
          local_320.val.m_backend.data._M_elems._40_8_ = uVar13;
          local_320.val.m_backend.data._M_elems._48_8_ = uVar10;
          local_320.val.m_backend.data._M_elems._56_8_ = uVar11;
          local_320.val.m_backend.exp = iVar6;
          local_320.val.m_backend.neg = bVar4;
          local_320.val.m_backend.fpclass = fVar7;
          local_320.val.m_backend.prec_elem = iVar8;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_4c0,compare,&local_d8,&local_320);
          if (local_4c0.fpclass == cpp_dec_float_NaN) break;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,0,(type *)0x0);
          iVar36 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_4c0,&t.m_backend);
          if (iVar36 < 0) break;
          uVar46 = uVar46 - 1;
          pfVar43 = pfVar43 + -0x15;
        } while (lVar39 < (long)uVar46);
      }
    }
    else {
      if ((int)uVar44 < (int)uVar41) {
        pfVar43 = &keys[(int)uVar44].val.m_backend.fpclass;
        do {
          local_12c.idx = pfVar43[-0x13];
          local_12c.val.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)(pfVar43 + -0x12))->data)._M_elems
          ;
          local_12c.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar43 + -0x10);
          local_12c.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar43 + -0xe);
          local_12c.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar43 + -0xc);
          local_12c.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar43 + -10);
          local_12c.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar43 + -8);
          local_12c.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar43 + -6);
          local_12c.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar43 + -4);
          local_12c.val.m_backend.exp = pfVar43[-2];
          local_12c.val.m_backend.neg = *(bool *)(pfVar43 + -1);
          local_12c.val.m_backend._72_8_ = *(undefined8 *)pfVar43;
          local_374.idx = iVar40;
          local_374.val.m_backend.data._M_elems._0_8_ = uVar16;
          local_374.val.m_backend.data._M_elems._8_8_ = uVar17;
          local_374.val.m_backend.data._M_elems._16_8_ = uVar14;
          local_374.val.m_backend.data._M_elems._24_8_ = uVar15;
          local_374.val.m_backend.data._M_elems._32_8_ = uVar12;
          local_374.val.m_backend.data._M_elems._40_8_ = uVar13;
          local_374.val.m_backend.data._M_elems._48_8_ = uVar10;
          local_374.val.m_backend.data._M_elems._56_8_ = uVar11;
          local_374.val.m_backend.exp = iVar6;
          local_374.val.m_backend.neg = bVar4;
          local_374.val.m_backend.fpclass = fVar7;
          local_374.val.m_backend.prec_elem = iVar8;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_4c0,compare,&local_12c,&local_374);
          if (local_4c0.fpclass == cpp_dec_float_NaN) break;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,0,(type *)0x0);
          iVar36 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_4c0,&t.m_backend);
          if (0 < iVar36) break;
          uVar44 = uVar44 + 1;
          pfVar43 = pfVar43 + 0x15;
        } while (uVar41 != uVar44);
      }
      if (start2 < (int)uVar45) {
        uVar46 = (ulong)(int)uVar45;
        pfVar43 = &keys[uVar46].val.m_backend.fpclass;
        do {
          local_180.idx = pfVar43[-0x13];
          local_180.val.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)(pfVar43 + -0x12))->data)._M_elems
          ;
          local_180.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar43 + -0x10);
          local_180.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar43 + -0xe);
          local_180.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar43 + -0xc);
          local_180.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar43 + -10);
          local_180.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar43 + -8);
          local_180.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar43 + -6);
          local_180.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar43 + -4);
          local_180.val.m_backend.exp = pfVar43[-2];
          local_180.val.m_backend.neg = *(bool *)(pfVar43 + -1);
          local_180.val.m_backend._72_8_ = *(undefined8 *)pfVar43;
          local_3c8.idx = iVar40;
          local_3c8.val.m_backend.data._M_elems._0_8_ = uVar16;
          local_3c8.val.m_backend.data._M_elems._8_8_ = uVar17;
          local_3c8.val.m_backend.data._M_elems._16_8_ = uVar14;
          local_3c8.val.m_backend.data._M_elems._24_8_ = uVar15;
          local_3c8.val.m_backend.data._M_elems._32_8_ = uVar12;
          local_3c8.val.m_backend.data._M_elems._40_8_ = uVar13;
          local_3c8.val.m_backend.data._M_elems._48_8_ = uVar10;
          local_3c8.val.m_backend.data._M_elems._56_8_ = uVar11;
          local_3c8.val.m_backend.exp = iVar6;
          local_3c8.val.m_backend.neg = bVar4;
          local_3c8.val.m_backend.fpclass = fVar7;
          local_3c8.val.m_backend.prec_elem = iVar8;
          SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::IdxCompare::operator()
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_4c0,compare,&local_180,&local_3c8);
          if (local_4c0.fpclass == cpp_dec_float_NaN) break;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,0,(type *)0x0);
          iVar36 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_4c0,&t.m_backend);
          if (iVar36 < 1) break;
          uVar46 = uVar46 - 1;
          pfVar43 = pfVar43 + -0x15;
        } while (lVar39 < (long)uVar46);
      }
    }
    uVar45 = (uint)uVar46;
    if ((int)uVar45 <= (int)uVar44) break;
    iVar36 = keys[(int)uVar44].idx;
    puVar2 = keys[(int)uVar44].val.m_backend.data._M_elems + 0xc;
    uVar18 = *(undefined8 *)puVar2;
    uVar19 = *(undefined8 *)(puVar2 + 2);
    puVar2 = keys[(int)uVar44].val.m_backend.data._M_elems + 8;
    uVar20 = *(undefined8 *)puVar2;
    uVar21 = *(undefined8 *)(puVar2 + 2);
    puVar2 = keys[(int)uVar44].val.m_backend.data._M_elems + 4;
    uVar22 = *(undefined8 *)puVar2;
    uVar23 = *(undefined8 *)(puVar2 + 2);
    uVar24 = *(undefined8 *)keys[(int)uVar44].val.m_backend.data._M_elems;
    uVar25 = *(undefined8 *)(keys[(int)uVar44].val.m_backend.data._M_elems + 2);
    iVar9 = keys[(int)uVar44].val.m_backend.exp;
    bVar5 = keys[(int)uVar44].val.m_backend.neg;
    keys[(int)uVar44].idx = keys[(int)uVar45].idx;
    uVar26 = *(undefined8 *)keys[(int)uVar45].val.m_backend.data._M_elems;
    uVar27 = *(undefined8 *)(keys[(int)uVar45].val.m_backend.data._M_elems + 2);
    puVar2 = keys[(int)uVar45].val.m_backend.data._M_elems + 4;
    uVar28 = *(undefined8 *)puVar2;
    uVar29 = *(undefined8 *)(puVar2 + 2);
    puVar2 = keys[(int)uVar45].val.m_backend.data._M_elems + 8;
    uVar30 = *(undefined8 *)puVar2;
    uVar31 = *(undefined8 *)(puVar2 + 2);
    puVar2 = keys[(int)uVar45].val.m_backend.data._M_elems + 0xc;
    uVar32 = *(undefined8 *)(puVar2 + 2);
    puVar3 = keys[(int)uVar44].val.m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar32;
    puVar2 = keys[(int)uVar44].val.m_backend.data._M_elems + 8;
    *(undefined8 *)puVar2 = uVar30;
    *(undefined8 *)(puVar2 + 2) = uVar31;
    puVar2 = keys[(int)uVar44].val.m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = uVar28;
    *(undefined8 *)(puVar2 + 2) = uVar29;
    *(undefined8 *)keys[(int)uVar44].val.m_backend.data._M_elems = uVar26;
    *(undefined8 *)(keys[(int)uVar44].val.m_backend.data._M_elems + 2) = uVar27;
    keys[(int)uVar44].val.m_backend.exp = keys[(int)uVar45].val.m_backend.exp;
    keys[(int)uVar44].val.m_backend.neg = keys[(int)uVar45].val.m_backend.neg;
    keys[(int)uVar45].idx = iVar36;
    *(undefined8 *)keys[(int)uVar45].val.m_backend.data._M_elems = uVar24;
    *(undefined8 *)(keys[(int)uVar45].val.m_backend.data._M_elems + 2) = uVar25;
    puVar2 = keys[(int)uVar45].val.m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = uVar22;
    *(undefined8 *)(puVar2 + 2) = uVar23;
    puVar2 = keys[(int)uVar45].val.m_backend.data._M_elems + 8;
    *(undefined8 *)puVar2 = uVar20;
    *(undefined8 *)(puVar2 + 2) = uVar21;
    puVar2 = keys[(int)uVar45].val.m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar2 = uVar18;
    *(undefined8 *)(puVar2 + 2) = uVar19;
    keys[(int)uVar45].val.m_backend.exp = iVar9;
    keys[(int)uVar45].val.m_backend.neg = bVar5;
    fVar34 = keys[(int)uVar44].val.m_backend.fpclass;
    iVar35 = keys[(int)uVar44].val.m_backend.prec_elem;
    iVar33 = keys[(int)uVar45].val.m_backend.prec_elem;
    keys[(int)uVar44].val.m_backend.fpclass = keys[(int)uVar45].val.m_backend.fpclass;
    keys[(int)uVar44].val.m_backend.prec_elem = iVar33;
    keys[(int)uVar45].val.m_backend.fpclass = fVar34;
    keys[(int)uVar45].val.m_backend.prec_elem = iVar35;
    uVar44 = uVar44 + 1;
    uVar45 = uVar45 - 1;
  } while( true );
  if (type) {
    if ((int)uVar44 < (int)uVar41) {
      pfVar43 = &keys[(int)uVar44].val.m_backend.fpclass;
      do {
        local_1d4.idx = pfVar43[-0x13];
        local_1d4.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)(pfVar43 + -0x12))->data)._M_elems;
        local_1d4.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar43 + -0x10);
        local_1d4.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar43 + -0xe);
        local_1d4.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar43 + -0xc);
        local_1d4.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar43 + -10);
        local_1d4.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar43 + -8);
        local_1d4.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar43 + -6);
        local_1d4.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar43 + -4);
        local_1d4.val.m_backend.exp = pfVar43[-2];
        local_1d4.val.m_backend.neg = *(bool *)(pfVar43 + -1);
        local_1d4.val.m_backend._72_8_ = *(undefined8 *)pfVar43;
        local_41c.idx = iVar40;
        local_41c.val.m_backend.data._M_elems._0_8_ = uVar16;
        local_41c.val.m_backend.data._M_elems._8_8_ = uVar17;
        local_41c.val.m_backend.data._M_elems._16_8_ = uVar14;
        local_41c.val.m_backend.data._M_elems._24_8_ = uVar15;
        local_41c.val.m_backend.data._M_elems._32_8_ = uVar12;
        local_41c.val.m_backend.data._M_elems._40_8_ = uVar13;
        local_41c.val.m_backend.data._M_elems._48_8_ = uVar10;
        local_41c.val.m_backend.data._M_elems._56_8_ = uVar11;
        local_41c.val.m_backend.exp = iVar6;
        local_41c.val.m_backend.neg = bVar4;
        local_41c.val.m_backend.fpclass = fVar7;
        local_41c.val.m_backend.prec_elem = iVar8;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_4c0,compare,&local_41c,&local_1d4);
        if (local_4c0.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&t.m_backend,0,(type *)0x0);
        iVar36 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_4c0,&t.m_backend);
        if (iVar36 < 0) break;
        uVar44 = uVar44 + 1;
        pfVar43 = pfVar43 + 0x15;
      } while (uVar41 != uVar44);
    }
    if (uVar44 == start2) {
      iVar40 = keys[(int)uVar44].idx;
      puVar2 = keys[(int)uVar44].val.m_backend.data._M_elems + 0xc;
      uVar10 = *(undefined8 *)puVar2;
      uVar11 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar44].val.m_backend.data._M_elems + 8;
      uVar12 = *(undefined8 *)puVar2;
      uVar13 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar44].val.m_backend.data._M_elems + 4;
      uVar14 = *(undefined8 *)puVar2;
      uVar15 = *(undefined8 *)(puVar2 + 2);
      uVar16 = *(undefined8 *)keys[(int)uVar44].val.m_backend.data._M_elems;
      uVar17 = *(undefined8 *)(keys[(int)uVar44].val.m_backend.data._M_elems + 2);
      iVar6 = keys[(int)uVar44].val.m_backend.exp;
      bVar4 = keys[(int)uVar44].val.m_backend.neg;
      keys[(int)uVar44].idx = pIVar1->idx;
      uVar18 = *(undefined8 *)(pnVar38->m_backend).data._M_elems;
      uVar19 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 2);
      uVar20 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 4);
      uVar21 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 6);
      uVar22 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 8);
      uVar23 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 10);
      uVar24 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 0xe);
      puVar2 = keys[(int)uVar44].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 0xc);
      *(undefined8 *)(puVar2 + 2) = uVar24;
      puVar2 = keys[(int)uVar44].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar22;
      *(undefined8 *)(puVar2 + 2) = uVar23;
      puVar2 = keys[(int)uVar44].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar20;
      *(undefined8 *)(puVar2 + 2) = uVar21;
      *(undefined8 *)keys[(int)uVar44].val.m_backend.data._M_elems = uVar18;
      *(undefined8 *)(keys[(int)uVar44].val.m_backend.data._M_elems + 2) = uVar19;
      keys[(int)uVar44].val.m_backend.exp = (pIVar1->val).m_backend.exp;
      keys[(int)uVar44].val.m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar40;
      *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 0xc) = uVar10;
      *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 0xe) = uVar11;
      *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 8) = uVar12;
      *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 10) = uVar13;
      *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 4) = uVar14;
      *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 6) = uVar15;
      *(undefined8 *)(pnVar38->m_backend).data._M_elems = uVar16;
      *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 2) = uVar17;
      (pIVar1->val).m_backend.exp = iVar6;
      (pIVar1->val).m_backend.neg = bVar4;
      fVar7 = keys[(int)uVar44].val.m_backend.fpclass;
      iVar33 = keys[(int)uVar44].val.m_backend.prec_elem;
      iVar8 = (pIVar1->val).m_backend.prec_elem;
      keys[(int)uVar44].val.m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      keys[(int)uVar44].val.m_backend.prec_elem = iVar8;
      (pIVar1->val).m_backend.fpclass = fVar7;
      (pIVar1->val).m_backend.prec_elem = iVar33;
      uVar44 = uVar44 + 1;
    }
  }
  else {
    if (start2 < (int)uVar45) {
      uVar46 = (ulong)(int)uVar45;
      pfVar43 = &keys[uVar46].val.m_backend.fpclass;
      do {
        local_228.idx = pfVar43[-0x13];
        local_228.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)(pfVar43 + -0x12))->data)._M_elems;
        local_228.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar43 + -0x10);
        local_228.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar43 + -0xe);
        local_228.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar43 + -0xc);
        local_228.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar43 + -10);
        local_228.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(pfVar43 + -8);
        local_228.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)(pfVar43 + -6);
        local_228.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(pfVar43 + -4);
        local_228.val.m_backend.exp = pfVar43[-2];
        local_228.val.m_backend.neg = *(bool *)(pfVar43 + -1);
        local_228.val.m_backend._72_8_ = *(undefined8 *)pfVar43;
        local_470.idx = iVar40;
        local_470.val.m_backend.data._M_elems._0_8_ = uVar16;
        local_470.val.m_backend.data._M_elems._8_8_ = uVar17;
        local_470.val.m_backend.data._M_elems._16_8_ = uVar14;
        local_470.val.m_backend.data._M_elems._24_8_ = uVar15;
        local_470.val.m_backend.data._M_elems._32_8_ = uVar12;
        local_470.val.m_backend.data._M_elems._40_8_ = uVar13;
        local_470.val.m_backend.data._M_elems._48_8_ = uVar10;
        local_470.val.m_backend.data._M_elems._56_8_ = uVar11;
        local_470.val.m_backend.exp = iVar6;
        local_470.val.m_backend.neg = bVar4;
        local_470.val.m_backend.fpclass = fVar7;
        local_470.val.m_backend.prec_elem = iVar8;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_4c0,compare,&local_470,&local_228);
        if (local_4c0.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&t.m_backend,0,(type *)0x0);
        iVar36 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_4c0,&t.m_backend);
        if (0 < iVar36) break;
        uVar46 = uVar46 - 1;
        pfVar43 = pfVar43 + -0x15;
      } while (lVar39 < (long)uVar46);
    }
    uVar45 = (uint)uVar46;
    if (uVar45 == uVar41) {
      iVar40 = keys[(int)uVar45].idx;
      puVar2 = keys[(int)uVar45].val.m_backend.data._M_elems + 0xc;
      uVar10 = *(undefined8 *)puVar2;
      uVar11 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar45].val.m_backend.data._M_elems + 8;
      uVar12 = *(undefined8 *)puVar2;
      uVar13 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[(int)uVar45].val.m_backend.data._M_elems + 4;
      uVar14 = *(undefined8 *)puVar2;
      uVar15 = *(undefined8 *)(puVar2 + 2);
      uVar16 = *(undefined8 *)keys[(int)uVar45].val.m_backend.data._M_elems;
      uVar17 = *(undefined8 *)(keys[(int)uVar45].val.m_backend.data._M_elems + 2);
      iVar6 = keys[(int)uVar45].val.m_backend.exp;
      bVar4 = keys[(int)uVar45].val.m_backend.neg;
      keys[(int)uVar45].idx = pIVar1->idx;
      uVar18 = *(undefined8 *)(pnVar38->m_backend).data._M_elems;
      uVar19 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 2);
      uVar20 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 4);
      uVar21 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 6);
      uVar22 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 8);
      uVar23 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 10);
      uVar24 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 0xe);
      puVar2 = keys[(int)uVar45].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 0xc);
      *(undefined8 *)(puVar2 + 2) = uVar24;
      puVar2 = keys[(int)uVar45].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar22;
      *(undefined8 *)(puVar2 + 2) = uVar23;
      puVar2 = keys[(int)uVar45].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar20;
      *(undefined8 *)(puVar2 + 2) = uVar21;
      *(undefined8 *)keys[(int)uVar45].val.m_backend.data._M_elems = uVar18;
      *(undefined8 *)(keys[(int)uVar45].val.m_backend.data._M_elems + 2) = uVar19;
      keys[(int)uVar45].val.m_backend.exp = (pIVar1->val).m_backend.exp;
      keys[(int)uVar45].val.m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar40;
      *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 0xc) = uVar10;
      *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 0xe) = uVar11;
      *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 8) = uVar12;
      *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 10) = uVar13;
      *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 4) = uVar14;
      *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 6) = uVar15;
      *(undefined8 *)(pnVar38->m_backend).data._M_elems = uVar16;
      *(undefined8 *)((pIVar37->val).m_backend.data._M_elems + 2) = uVar17;
      (pIVar1->val).m_backend.exp = iVar6;
      (pIVar1->val).m_backend.neg = bVar4;
      fVar7 = keys[(int)uVar45].val.m_backend.fpclass;
      iVar33 = keys[(int)uVar45].val.m_backend.prec_elem;
      iVar8 = (pIVar1->val).m_backend.prec_elem;
      keys[(int)uVar45].val.m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      keys[(int)uVar45].val.m_backend.prec_elem = iVar8;
      (pIVar1->val).m_backend.fpclass = fVar7;
      (pIVar1->val).m_backend.prec_elem = iVar33;
      uVar45 = uVar45 - 1;
    }
  }
  if ((int)(uVar45 - start2) < size * 2) {
    SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (keys,uVar45 + 1,compare,start2,!type);
    if (size <= (int)(uVar44 - start2)) {
      return uVar44 - 1;
    }
    size = (start2 + size) - uVar44;
    start2 = uVar44;
  }
  else {
    end = uVar45 + 1;
  }
  iVar40 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                     (keys,compare,start,end,size,start2,end2,!type);
  return iVar40;
}

Assistant:

int SPxQuicksortPart(T* keys, COMPARATOR& compare, int start, int end, int size, int start2 = 0,
                     int end2 = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end < start + 1)
      return 0;
   else if(end == start + 1)
      return 1;

   /* we assume that range {start, ..., start2-1} already contains the start2-start smallest elements in sorted order;
    * start2 has to lie in {start, ..., end-1} */
   if(start2 < start)
      start2 = start;

#ifdef CHECK_SORTING
   assert(start2 < end);

   for(int i = start; i < start2 - 1; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
   assert(end2 <= end);

   /* if all remaining elements should be sorted, we simply call standard quicksort */
   if(start2 + size >= end - 1)
   {
      SPxQuicksort(keys, end, compare, start2, type);
      return end - 1;
   }

   T pivotkey;
   T tmp;
   int lo;
   int hi;
   int mid;

   /* reduce end position to last element index */
   --end;

   /* select pivot element */
   mid = (start2 + end) / 2;
   pivotkey = keys[mid];

   /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
   lo = start2;
   hi = end;

   for(;;)
   {
      if(type)
      {
         while(lo < end && compare(keys[lo], pivotkey) < 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) >= 0)
            hi--;
      }
      else
      {
         while(lo < end && compare(keys[lo], pivotkey) <= 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) > 0)
            hi--;
      }

      if(lo >= hi)
         break;

      tmp = keys[lo];
      keys[lo] = keys[hi];
      keys[hi] = tmp;

      lo++;
      hi--;
   }

   assert((hi == lo - 1) || (type && hi == start2) || (!type && lo == end));

   /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
   if(type)
   {
      while(lo < end && compare(pivotkey, keys[lo]) >= 0)
         lo++;

      /* make sure that we have at least one element in the smaller partition */
      if(lo == start2)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[lo];
         keys[lo] = keys[mid];
         keys[mid] = tmp;

         lo++;
      }
   }
   else
   {
      while(hi > start2 && compare(pivotkey, keys[hi]) <= 0)
         hi--;

      /* make sure that we have at least one element in the smaller partition */
      if(hi == end)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[hi];
         keys[hi] = keys[mid];
         keys[mid] = tmp;

         hi--;
      }
   }

#ifdef CHECK_SORTING

   for(int i = start2; i < lo; ++i)
      assert(compare(keys[i], pivotkey) <= 0);

#endif

   /* if we only need to sort less than half of the "<" part, use partial sort again */
   if(2 * size <= hi - start2)
   {
      return SPxQuicksortPart(keys, compare, start, hi + 1, size, start2, end2, !type);
   }
   /* otherwise, and if we do not need to sort the ">" part, use standard quicksort on the "<" part */
   else if(size <= lo - start2)
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return lo - 1;
   }
   /* otherwise we have to sort the "<" part fully (use standard quicksort) and the ">" part partially */
   else
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return SPxQuicksortPart(keys, compare, start, end + 1, size + start2 - lo, lo, end2, !type);
   }
}